

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void __thiscall mat_lib::matrix<double>::matrix(matrix<double> *this,string *file_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char *__nptr;
  double dVar3;
  _Alloc_hider _Var4;
  long *__s;
  bool bVar5;
  size_t sVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  element_t *peVar10;
  ostream *poVar11;
  logic_error *plVar12;
  int iVar13;
  size_t *psVar14;
  long lVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  cmatch results;
  regex rx;
  string str;
  ifstream ifs;
  string_type local_468;
  ulong local_448;
  int local_43c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  size_t *local_420;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_418;
  anon_union_16_2_ba345be5_for_m_Storage local_3f8;
  ulong local_3e8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_3e0;
  iterator_range<const_char_*> local_3c0;
  long *local_3b0 [2];
  long local_3a0 [45];
  long local_238 [4];
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  (this->super_base_matrix<double>).format__ = fixed;
  (this->super_base_matrix<double>).fractional_digits__ = 6;
  this->rows__ = 0;
  this->columns__ = 0;
  this->elements__ = (element_t *)0x0;
  std::ifstream::ifstream(local_238,(string *)file_name,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
LAB_0013f8ce:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"cannot open file \"",0x12);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,(file_name->_M_dataplus)._M_p,
                         file_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"! (",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"matrix",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"() in ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x11e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(plVar12,(string *)&local_3e0);
    __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)local_3b0,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_3e0,
             "mat_lib::matrix\\[(\\d+)x(\\d)\\]\\{\\n\\s*(([-+]?\\d*\\.?\\d+([eE][-+]?\\d+)?(,\\s|\\n\\s*)?)+)+\\n\\}"
             ,0x10);
  __s = local_3b0[0];
  local_418.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418._M_begin = (char *)0x0;
  local_418.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar6 = strlen((char *)local_3b0[0]);
  bVar5 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((char *)__s,(char *)((long)__s + sVar6),&local_418,&local_3e0,0);
  if (!bVar5) {
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar12,"the file are incorrect: bad expresion");
    __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str(&local_468,&local_418,1);
  _Var4._M_p = local_468._M_dataplus._M_p;
  puVar7 = (uint *)__errno_location();
  uVar2 = *puVar7;
  *puVar7 = 0;
  lVar8 = strtol(_Var4._M_p,(char **)&local_438,10);
  if (local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)_Var4._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_0013fa22:
    std::__throw_out_of_range("stoi");
LAB_0013fa2e:
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (((int)lVar8 != lVar8) || (*puVar7 == 0x22)) goto LAB_0013fa22;
    if (*puVar7 == 0) {
      *puVar7 = uVar2;
    }
    this->rows__ = (long)(int)lVar8;
    paVar1 = &local_468.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar1) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    local_420 = &this->rows__;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&local_468,&local_418,2);
    _Var4._M_p = local_468._M_dataplus._M_p;
    uVar2 = *puVar7;
    *puVar7 = 0;
    lVar8 = strtol(local_468._M_dataplus._M_p,(char **)&local_438,10);
    psVar14 = local_420;
    if (local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)_Var4._M_p) goto LAB_0013fa2e;
    if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*puVar7 != 0x22)) {
      if (*puVar7 == 0) {
        *puVar7 = uVar2;
      }
      this->columns__ = (long)(int)lVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != paVar1) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::
      match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
                (&local_468,&local_418,3);
      local_3c0.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "(,|\n)";
      local_3c0.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                ((is_any_ofF<char> *)&local_3f8,&local_3c0);
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
                (&local_438,&local_468,(is_any_ofF<char> *)&local_3f8,token_compress_off);
      if ((0x10 < local_3e8) && (local_3f8.m_dynSet != (set_value_type *)0x0)) {
        operator_delete__(local_3f8.m_dynSet);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != paVar1) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      uVar9 = this->columns__ * this->rows__;
      if ((long)local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar9) {
        peVar10 = (element_t *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
        this->elements__ = peVar10;
        if (this->rows__ != 0) {
          local_448 = 0;
          iVar13 = 0;
          do {
            if (this->columns__ != 0) {
              lVar15 = (long)iVar13 << 5;
              lVar8 = 0;
              uVar9 = 0;
              local_43c = iVar13;
              do {
                __nptr = *(char **)((long)&((local_438.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar15);
                uVar2 = *puVar7;
                file_name = (string *)(ulong)uVar2;
                *puVar7 = 0;
                dVar3 = strtod(__nptr,(char **)&local_468);
                if (local_468._M_dataplus._M_p == __nptr) {
                  std::__throw_invalid_argument("stod");
LAB_0013f8c2:
                  std::__throw_out_of_range("stod");
                  goto LAB_0013f8ce;
                }
                if (*puVar7 == 0) {
                  *puVar7 = uVar2;
                }
                else if (*puVar7 == 0x22) goto LAB_0013f8c2;
                *(double *)
                 ((long)this->elements__ + (lVar8 >> 0x1d) + this->columns__ * local_448 * 8) =
                     dVar3;
                uVar9 = uVar9 + 1;
                lVar15 = lVar15 + 0x20;
                lVar8 = lVar8 + 0x100000000;
              } while (uVar9 < this->columns__);
              iVar13 = local_43c + (int)uVar9;
              psVar14 = local_420;
            }
            local_448 = local_448 + 1;
          } while (local_448 < *psVar14);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_438);
        if (local_418.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_418.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_418.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_418.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3e0)
        ;
        if (local_3b0[0] != local_3a0) {
          operator_delete(local_3b0[0],local_3a0[0] + 1);
        }
        std::ifstream::~ifstream(local_238);
        return;
      }
      goto LAB_0013fa46;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0013fa46:
  plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar12,"the file are incorrect: bad declaration of matrix");
  __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

matrix<T>::matrix(const string& file_name) // constructor from a file
  : rows__{0},
    columns__{0},
    elements__{nullptr}
  {
    ifstream ifs(file_name);
    if(!ifs)
    {
      ostringstream str_stream;
      str_stream<<"cannot open file \""<<file_name<<"\"! ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw logic_error(str_stream.str());
    }

    string str((istreambuf_iterator<char>(ifs)),
               istreambuf_iterator<char>());

    regex rx(R"(mat_lib::matrix\[(\d+)x(\d)\]\{\n\s*(([-+]?\d*\.?\d+([eE][-+]?\d+)?(,\s|\n\s*)?)+)+\n\})");
    cmatch results;
    if (not regex_match(str.c_str(),results,rx)) {
        throw logic_error("the file are incorrect: bad expresion");
    }

    rows__ = stoi(results.str(1));
    columns__ = stoi(results.str(2));
    vector<string> numbers;
    boost::split(numbers, results.str(3), boost::is_any_of("(,|\n)"));


    if (numbers.size() != rows__*columns__) {
      throw logic_error("the file are incorrect: bad declaration of matrix");
    }

    elements__ = new element_t[rows__*columns__];

    int index = 0;
    for(size_t i=0; i<rows__; i++){
      for(size_t j=0; j<columns__; j++) {
          elements__[offset__(i, j)] = stod(numbers[index]);
          index++;
      }
    }
  }